

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

int __thiscall QDate::dayOfYear(QDate *this)

{
  long lVar1;
  qint64 qVar2;
  bool bVar3;
  longlong *plVar4;
  QDate *in_RDI;
  long in_FS_OFFSET;
  optional<long_long> first;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_1c;
  int day;
  undefined1 *puVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = isValid(in_RDI);
  if (bVar3) {
    day = -0x55555556;
    puVar5 = &DAT_aaaaaaaaaaaaaaaa;
    year((QDate *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    QGregorianCalendar::julianFromParts((int)((ulong)puVar5 >> 0x20),(int)puVar5,day);
    bVar3 = std::optional::operator_cast_to_bool((optional<long_long> *)0x565ed3);
    if (bVar3) {
      qVar2 = in_RDI->jd;
      plVar4 = std::optional<long_long>::operator*((optional<long_long> *)0x565ef0);
      local_1c = ((int)qVar2 - (int)*plVar4) + 1;
      goto LAB_00565f0f;
    }
  }
  local_1c = 0;
LAB_00565f0f:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_1c;
}

Assistant:

int QDate::dayOfYear() const
{
    if (isValid()) {
        if (const auto first = QGregorianCalendar::julianFromParts(year(), 1, 1))
            return jd - *first + 1;
    }
    return 0;
}